

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O1

void __thiscall Sandbox::onPlot(Sandbox *this)

{
  Tracker *pTVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  float *pfVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  mapped_type pTVar9;
  uint uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  long lVar15;
  Texture *pTVar16;
  mapped_type *ppTVar17;
  ulong uVar18;
  double dVar19;
  float fVar20;
  float fVar21;
  string local_60;
  float local_40;
  float local_3c;
  Tracker *local_38;
  
  if ((this->m_sceneRender).renderFbo.m_allocated != true) {
    return;
  }
  if ((this->m_plot - PLOT_LUMA < 5) && (bVar11 = haveChange(this), bVar11)) {
    pTVar1 = &(this->uniforms).tracker;
    if ((this->uniforms).tracker.m_running == true) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"plot::histogram","");
      Tracker::begin(pTVar1,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    local_38 = pTVar1;
    glBindFramebuffer(0x8d40,(this->m_sceneRender).renderFbo.m_fbo_id);
    iVar12 = vera::getWindowWidth();
    iVar13 = vera::getWindowHeight();
    uVar10 = iVar12 * iVar13 * 3;
    pvVar14 = operator_new__((long)(int)uVar10);
    glReadPixels(0,0,iVar12,iVar13,0x1907,0x1401,pvVar14);
    glBindFramebuffer(0x8d40,0);
    if ((int)uVar10 < 1) {
      local_40 = 0.0;
      local_3c = 0.0;
    }
    else {
      local_3c = 0.0;
      uVar18 = 0;
      local_40 = 0.0;
      do {
        bVar6 = *(byte *)((long)pvVar14 + uVar18);
        fVar20 = this->m_plot_values[bVar6].field_0.x + 1.0;
        this->m_plot_values[bVar6].field_0.x = fVar20;
        bVar7 = *(byte *)((long)pvVar14 + uVar18 + 1);
        if (fVar20 <= local_3c) {
          fVar20 = local_3c;
        }
        fVar21 = this->m_plot_values[bVar7].field_1.y + 1.0;
        this->m_plot_values[bVar7].field_1.y = fVar21;
        if (fVar21 <= fVar20) {
          fVar21 = fVar20;
        }
        bVar8 = *(byte *)((long)pvVar14 + uVar18 + 2);
        local_3c = this->m_plot_values[bVar8].field_2.z + 1.0;
        this->m_plot_values[bVar8].field_2.z = local_3c;
        if (local_3c <= fVar21) {
          local_3c = fVar21;
        }
        iVar12 = (int)((double)bVar8 * 0.114 + (double)bVar6 * 0.299 + (double)bVar7 * 0.587);
        fVar20 = this->m_plot_values[iVar12].field_3.w + 1.0;
        this->m_plot_values[iVar12].field_3.w = fVar20;
        if (fVar20 <= local_40) {
          fVar20 = local_40;
        }
        local_40 = fVar20;
        uVar18 = uVar18 + 3;
      } while (uVar18 < uVar10);
    }
    operator_delete__(pvVar14);
    lVar15 = 0;
    do {
      uVar4 = *(undefined8 *)((long)&this->m_plot_values[0].field_0 + lVar15);
      uVar5 = *(undefined8 *)((long)&this->m_plot_values[0].field_2 + lVar15);
      pfVar3 = (float *)((long)&this->m_plot_values[0].field_0 + lVar15);
      *pfVar3 = (float)uVar4 / local_3c;
      pfVar3[1] = (float)((ulong)uVar4 >> 0x20) / local_3c;
      pfVar3[2] = (float)uVar5 / local_3c;
      pfVar3[3] = (float)((ulong)uVar5 >> 0x20) / local_40;
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0x1000);
    if (this->m_plot_texture == (Texture *)0x0) {
      pTVar16 = (Texture *)operator_new(0x48);
      vera::Texture::Texture(pTVar16);
      this->m_plot_texture = pTVar16;
    }
    (*this->m_plot_texture->_vptr_Texture[6])
              (this->m_plot_texture,0x100,1,4,0x20,this->m_plot_values,1,1);
    pTVar9 = this->m_plot_texture;
    paVar2 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"u_histogram","");
    ppTVar17 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
               ::operator[](&(this->uniforms).super_Scene.textures,&local_60);
    *ppTVar17 = pTVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    Uniforms::flagChange(&this->uniforms);
    if ((this->uniforms).tracker.m_running != true) {
      return;
    }
    local_60._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"plot::histogram","");
    Tracker::end(local_38,&local_60);
  }
  else if (this->m_plot == PLOT_MS) {
    pTVar1 = &(this->uniforms).tracker;
    if ((this->uniforms).tracker.m_running == true) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"plot::ms","");
      Tracker::begin(pTVar1,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    memmove(this->m_plot_values,this->m_plot_values + 1,0xff0);
    dVar19 = vera::getDelta();
    this->m_plot_values[0xff].field_0.x = (float)dVar19;
    this->m_plot_values[0xff].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    this->m_plot_values[0xff].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    this->m_plot_values[0xff].field_3.w = 1.0;
    if (this->m_plot_texture == (Texture *)0x0) {
      pTVar16 = (Texture *)operator_new(0x48);
      vera::Texture::Texture(pTVar16);
      this->m_plot_texture = pTVar16;
    }
    (*this->m_plot_texture->_vptr_Texture[6])
              (this->m_plot_texture,0x100,1,4,0x20,this->m_plot_values,1,1);
    if ((this->uniforms).tracker.m_running != true) {
      return;
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"plot::ms","");
    Tracker::end(pTVar1,&local_60);
  }
  else {
    if (this->m_plot != PLOT_FPS) {
      return;
    }
    pTVar1 = &(this->uniforms).tracker;
    if ((this->uniforms).tracker.m_running == true) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"plot::fps","");
      Tracker::begin(pTVar1,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    memmove(this->m_plot_values,this->m_plot_values + 1,0xff0);
    dVar19 = vera::getFps();
    this->m_plot_values[0xff].field_0.x = (float)(dVar19 / 60.0);
    this->m_plot_values[0xff].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    this->m_plot_values[0xff].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    this->m_plot_values[0xff].field_3.w = 1.0;
    if (this->m_plot_texture == (Texture *)0x0) {
      pTVar16 = (Texture *)operator_new(0x48);
      vera::Texture::Texture(pTVar16);
      this->m_plot_texture = pTVar16;
    }
    (*this->m_plot_texture->_vptr_Texture[6])
              (this->m_plot_texture,0x100,1,4,0x20,this->m_plot_values,1,1);
    if ((this->uniforms).tracker.m_running != true) {
      return;
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"plot::fps","");
    Tracker::end(pTVar1,&local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Sandbox::onPlot() {
    // if ( !vera::isGL() )
    //     return;
    if (!m_sceneRender.renderFbo.isAllocated())
        return;

    if ( (m_plot == PLOT_LUMA || m_plot == PLOT_RGB || m_plot == PLOT_RED || m_plot == PLOT_GREEN || m_plot == PLOT_BLUE ) && haveChange() ) {
        TRACK_BEGIN("plot::histogram")


        // Extract pixels
        glBindFramebuffer(GL_FRAMEBUFFER, m_sceneRender.renderFbo.getId());
        int w = vera::getWindowWidth();
        int h = vera::getWindowHeight();
        int c = 3;
        int total = w * h * c;
        unsigned char* pixels = new unsigned char[total];
        glReadPixels(0, 0, w, h, GL_RGB, GL_UNSIGNED_BYTE, pixels);
        glBindFramebuffer(GL_FRAMEBUFFER, 0);

        // Count frequencies of appearances 
        float max_rgb_freq = 0;
        float max_luma_freq = 0;
        glm::vec4 freqs[256];
        for (int i = 0; i < total; i += c) {
            m_plot_values[pixels[i]].r++;
            if (m_plot_values[pixels[i]].r > max_rgb_freq)
                max_rgb_freq = m_plot_values[pixels[i]].r;

            m_plot_values[pixels[i+1]].g++;
            if (m_plot_values[pixels[i+1]].g > max_rgb_freq)
                max_rgb_freq = m_plot_values[pixels[i+1]].g;

            m_plot_values[pixels[i+2]].b++;
            if (m_plot_values[pixels[i+2]].b > max_rgb_freq)
                max_rgb_freq = m_plot_values[pixels[i+2]].b;

            int luma = 0.299 * pixels[i] + 0.587 * pixels[i+1] + 0.114 * pixels[i+2];
            m_plot_values[luma].a++;
            if (m_plot_values[luma].a > max_luma_freq)
                max_luma_freq = m_plot_values[luma].a;
        }
        delete[] pixels;

        // Normalize frequencies
        for (int i = 0; i < 256; i ++)
            m_plot_values[i] = m_plot_values[i] / glm::vec4(max_rgb_freq, max_rgb_freq, max_rgb_freq, max_luma_freq);

        if (m_plot_texture == nullptr)
            m_plot_texture = new vera::Texture();
        m_plot_texture->load(256, 1, 4, 32, &m_plot_values[0], vera::NEAREST, vera::CLAMP);

        uniforms.textures["u_histogram"] = m_plot_texture;
        uniforms.flagChange();
        TRACK_END("plot::histogram")
    }

    else if (m_plot == PLOT_FPS ) {
        TRACK_BEGIN("plot::fps")

        // Push back values one position
        for (int i = 0; i < 255; i ++)
            m_plot_values[i] = m_plot_values[i+1];
        m_plot_values[255] = glm::vec4( vera::getFps()/60.0f, 0.0f, 0.0f, 1.0f);

        if (m_plot_texture == nullptr)
            m_plot_texture = new vera::Texture();

        m_plot_texture->load(256, 1, 4, 32, &m_plot_values[0], vera::NEAREST, vera::CLAMP);
        // uniforms.textures["u_sceneFps"] = m_plot_texture;

        TRACK_END("plot::fps")
    }

    else if (m_plot == PLOT_MS ) {
        TRACK_BEGIN("plot::ms")

        // Push back values one position
        for (int i = 0; i < 255; i ++)
            m_plot_values[i] = m_plot_values[i+1];
        m_plot_values[255] = glm::vec4( vera::getDelta(), 0.0f, 0.0f, 1.0f);

        if (m_plot_texture == nullptr)
            m_plot_texture = new vera::Texture();

        m_plot_texture->load(256, 1, 4, 32, &m_plot_values[0], vera::NEAREST, vera::CLAMP);

        // uniforms.textures["u_sceneMs"] = m_plot_texture;

        TRACK_END("plot::ms")
    }
}